

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu383_com.c
# Opt level: O2

RK_S32 vdpu383_get_rcb_buf_size(Vdpu383RcbInfo *info,RK_S32 width,RK_S32 height)

{
  RK_S32 buf_size;
  uint uVar1;
  RK_S32 buf_size_1;
  uint uVar2;
  int iVar3;
  
  buf_size = width * 6;
  uVar1 = buf_size + 0x7eU & 0xffffff80;
  info->reg_idx = 0x8c;
  *(undefined8 *)&info->offset = 0x8e00000000;
  info->size = uVar1;
  info[1].offset = uVar1;
  info[1].size = uVar1;
  uVar2 = width * 0xc + 0x7eU & 0xffffff80;
  info[2].reg_idx = 0x90;
  info[2].offset = uVar1 * 2;
  info[2].size = uVar2;
  iVar3 = uVar2 + uVar1 * 2;
  info[3].reg_idx = 0x92;
  info[3].offset = iVar3;
  info[3].size = uVar2;
  iVar3 = uVar2 + iVar3;
  uVar1 = width * 10 + 0x7eU & 0xffffff80;
  info[4].reg_idx = 0x94;
  info[4].offset = iVar3;
  info[4].size = uVar1;
  iVar3 = iVar3 + uVar1;
  info[5].reg_idx = 0x96;
  info[5].offset = iVar3;
  info[5].size = uVar1;
  iVar3 = iVar3 + uVar1;
  uVar1 = width * 0x78 + 0x7eU & 0xffffff80;
  info[6].reg_idx = 0x98;
  info[6].offset = iVar3;
  info[6].size = uVar1;
  iVar3 = iVar3 + uVar1;
  info[7].reg_idx = 0x9a;
  info[7].offset = iVar3;
  info[7].size = uVar1;
  iVar3 = iVar3 + uVar1;
  info[8].reg_idx = 0x9c;
  info[8].offset = iVar3;
  info[8].size = uVar1;
  iVar3 = iVar3 + uVar1;
  uVar1 = height * 0xb4 + 0x7eU & 0xffffff80;
  info[9].reg_idx = 0x9e;
  info[9].offset = iVar3;
  info[9].size = uVar1;
  iVar3 = uVar1 + iVar3;
  info[10].reg_idx = 0xa0;
  info[10].size = 0;
  info[10].offset = iVar3;
  return iVar3;
}

Assistant:

static RK_S32 update_size_offset(Vdpu383RcbInfo *info, RK_U32 reg_idx,
                                 RK_S32 offset, RK_S32 len, RK_S32 idx)
{
    RK_S32 buf_size = 0;

    buf_size = 2 * MPP_ALIGN(len * rcb_coeff[idx], RCB_ALLINE_SIZE);
    info[idx].reg_idx = reg_idx;
    info[idx].offset = offset;
    info[idx].size = buf_size;

    return buf_size;
}